

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Object_State_Header::operator==(Object_State_Header *this,Object_State_Header *Value)

{
  KBOOL KVar1;
  Object_State_Header *Value_local;
  Object_State_Header *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_ObjID,&Value->m_ObjID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_RefObjID,&Value->m_RefObjID);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else if (this->m_ui16UpdateNum == Value->m_ui16UpdateNum) {
        if (this->m_ui8ForceID == Value->m_ui8ForceID) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Object_State_Header::operator == ( const Object_State_Header & Value ) const
{
    if( Header::operator != ( Value ) )             return false;
    if( m_ObjID          != Value.m_ObjID )         return false;
    if( m_RefObjID       != Value.m_RefObjID )      return false;
    if( m_ui16UpdateNum  != Value.m_ui16UpdateNum ) return false;
    if( m_ui8ForceID     != Value.m_ui8ForceID )    return false;
    return true;
}